

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O0

void makeMappings(vector<int,_std::allocator<int>_> *mapping,string *mapstring)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  reference pvVar5;
  value_type local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_60;
  int i;
  int local_4c;
  int local_48;
  int ii;
  int digit2;
  int digit1;
  int d;
  int ltx;
  string newmap;
  string *mapstring_local;
  vector<int,_std::allocator<int>_> *mapping_local;
  
  newmap.field_2._8_8_ = mapstring;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,mapstring,
                 ' ');
  bVar1 = false;
  bVar2 = true;
  ii = 0;
  local_48 = 0;
  for (local_4c = 0; iVar3 = std::__cxx11::string::size(), local_4c < iVar3; local_4c = local_4c + 1
      ) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&d);
    iVar3 = isdigit((int)*pcVar4);
    if (iVar3 != 0) break;
  }
  for (local_60 = local_4c; iVar3 = std::__cxx11::string::size(), local_60 < iVar3;
      local_60 = local_60 + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&d);
    iVar3 = isdigit((int)*pcVar4);
    if (iVar3 == 0) {
      if (!bVar1) {
        bVar2 = (bool)(bVar2 ^ 1);
      }
      bVar1 = true;
      if (bVar2) {
        if (ii < 0x80) {
          local_a0 = ii;
        }
        else {
          local_a0 = 0x7f;
        }
        if (local_a0 < 0) {
          local_a4 = 0;
        }
        else {
          local_a4 = local_a0;
        }
        if (local_48 < 0x80) {
          local_a8 = local_48;
        }
        else {
          local_a8 = 0x7f;
        }
        if (local_a8 < 0) {
          local_ac = 0;
        }
        else {
          local_ac = local_a8;
        }
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](mapping,(long)local_a4);
        *pvVar5 = local_ac;
        ii = 0;
        local_48 = 0;
      }
    }
    else {
      if (bVar2) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&d);
        ii = ii * 10 + *pcVar4 + -0x30;
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&d);
        local_48 = local_48 * 10 + *pcVar4 + -0x30;
      }
      bVar1 = false;
    }
  }
  std::__cxx11::string::~string((string *)&d);
  return;
}

Assistant:

void makeMappings(vector<int>& mapping, const string& mapstring) {
   string newmap = mapstring + ' ';
   int ltx = 0;
   int d = 1;
   int digit1 = 0;
   int digit2 = 0;
   int ii;
   for (ii=0; ii<(int)newmap.size(); ii++) {
      if (isdigit(newmap[ii])) {
         break;
      }
   }
   for (int i=ii; i<(int)newmap.size(); i++) {
      if (isdigit(newmap[i])) {
        if (d) {
          digit1 = digit1 * 10 + (newmap[i] - '0');
        } else {
          digit2 = digit2 * 10 + (newmap[i] - '0');
        }
        ltx = 0;
      } else {
         if (!ltx) {
            d = !d;
         }
         ltx = 1;
         if (d) {
            digit1 = digit1 > 127 ? 127 : digit1;
            digit1 = digit1 <   0 ?   0 : digit1;
            digit2 = digit2 > 127 ? 127 : digit2;
            digit2 = digit2 <   0 ?   0 : digit2;
            mapping[digit1] = digit2;
            digit1 = 0;
            digit2 = 0;
         }
      }
   }
}